

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

bool __thiscall BaseIndex::StartBackgroundSync(BaseIndex *this)

{
  long *plVar1;
  logic_error *this_00;
  long in_FS_OFFSET;
  thread local_30;
  long *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_init)._M_base._M_i & 1U) == 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Error: Cannot start a non-initialized index");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  else {
    local_30._M_id._M_thread = (id)0;
    plVar1 = (long *)operator_new(0x38);
    *plVar1 = (long)&PTR___State_impl_0114fbb0;
    plVar1[1] = (long)this;
    std::__cxx11::string::string((string *)(plVar1 + 2),&this->m_name);
    plVar1[6] = (long)util::TraceThread;
    local_28 = plVar1;
    std::thread::_M_start_thread(&local_30,&local_28,0);
    if (local_28 != (long *)0x0) {
      (**(code **)(*local_28 + 8))();
    }
    std::thread::operator=(&this->m_thread_sync,&local_30);
    std::thread::~thread(&local_30);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return true;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool BaseIndex::StartBackgroundSync()
{
    if (!m_init) throw std::logic_error("Error: Cannot start a non-initialized index");

    m_thread_sync = std::thread(&util::TraceThread, GetName(), [this] { Sync(); });
    return true;
}